

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O3

set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> * __thiscall
MNS::Response::getHeaderNames
          (set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>
           *__return_storage_ptr__,Response *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  _Self __tmp;
  char *local_28;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var2 = (this->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->headers)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    local_28 = *(char **)(p_Var2 + 1);
    std::
    _Rb_tree<char_const*,char_const*,std::_Identity<char_const*>,std::less<char_const*>,std::allocator<char_const*>>
    ::_M_insert_unique<char_const*>
              ((_Rb_tree<char_const*,char_const*,std::_Identity<char_const*>,std::less<char_const*>,std::allocator<char_const*>>
                *)__return_storage_ptr__,&local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<const char *> MNS::Response::getHeaderNames() {
	std::set<const char*> headerNames;
	for(auto headerItem = this->headers.begin(); headerItem != this->headers.end(); headerItem++) {
		headerNames.insert(headerItem->first.c_str());
	}

	return headerNames;
}